

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void get_log_var_4x4sub_blk
               (AV1_COMP *cpi,YV12_BUFFER_CONFIG *frame_to_filter,int mb_row,int mb_col,
               BLOCK_SIZE block_size,double *blk_4x4_var_min,double *blk_4x4_var_max,int is_hbd)

{
  byte bVar1;
  byte bVar2;
  byte in_R8B;
  double *in_R9;
  double dVar3;
  double *in_stack_00000008;
  int var;
  int j;
  int i;
  aom_variance_fn_t vf;
  uint8_t *src_buf;
  int y_offset;
  int src_stride;
  int var_max;
  int var_min;
  int mb_width;
  int mb_height;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int iVar4;
  int iVar5;
  int local_38;
  int local_34;
  
  bVar1 = block_size_high[in_R8B];
  bVar2 = block_size_wide[in_R8B];
  local_34 = 0x7fffffff;
  local_38 = 0;
  for (iVar5 = 0; iVar5 < (int)(uint)bVar1; iVar5 = iVar5 + 4) {
    for (iVar4 = 0; iVar4 < (int)(uint)bVar2; iVar4 = iVar4 + 4) {
      in_stack_ffffffffffffffa4 =
           av1_calc_normalized_variance
                     ((aom_variance_fn_t)CONCAT44(iVar5,iVar4),
                      (uint8_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa4;
      if (local_34 < in_stack_ffffffffffffffa4) {
        in_stack_ffffffffffffffa0 = local_34;
      }
      in_stack_ffffffffffffff9c = in_stack_ffffffffffffffa4;
      if (in_stack_ffffffffffffffa4 < local_38) {
        in_stack_ffffffffffffff9c = local_38;
      }
      local_38 = in_stack_ffffffffffffff9c;
      local_34 = in_stack_ffffffffffffffa0;
    }
  }
  dVar3 = log1p((double)local_34 / 16.0);
  *in_R9 = dVar3;
  dVar3 = log1p((double)local_38 / 16.0);
  *in_stack_00000008 = dVar3;
  return;
}

Assistant:

static inline void get_log_var_4x4sub_blk(
    AV1_COMP *cpi, const YV12_BUFFER_CONFIG *const frame_to_filter, int mb_row,
    int mb_col, BLOCK_SIZE block_size, double *blk_4x4_var_min,
    double *blk_4x4_var_max, int is_hbd) {
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  int var_min = INT_MAX;
  int var_max = 0;

  // Derive the source buffer.
  const int src_stride = frame_to_filter->y_stride;
  const int y_offset = mb_row * mb_height * src_stride + mb_col * mb_width;
  const uint8_t *src_buf = frame_to_filter->y_buffer + y_offset;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (int i = 0; i < mb_height; i += MI_SIZE) {
    for (int j = 0; j < mb_width; j += MI_SIZE) {
      // Calculate the 4x4 sub-block variance.
      const int var = av1_calc_normalized_variance(
          vf, src_buf + (i * src_stride) + j, src_stride, is_hbd);

      // Record min and max for over-arching block
      var_min = AOMMIN(var_min, var);
      var_max = AOMMAX(var_max, var);
    }
  }

  *blk_4x4_var_min = log1p(var_min / 16.0);
  *blk_4x4_var_max = log1p(var_max / 16.0);
}